

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GEN_Register.cpp
# Opt level: O2

uint8_t __thiscall GEN_Register::getReg_8(GEN_Register *this,string *flagName)

{
  bool bVar1;
  bitset<8UL> *pbVar2;
  
  bVar1 = std::operator==(flagName,"AH");
  if (bVar1) {
    pbVar2 = &AH;
  }
  else {
    bVar1 = std::operator==(flagName,"AL");
    if (bVar1) {
      pbVar2 = &AL;
    }
    else {
      bVar1 = std::operator==(flagName,"DH");
      if (bVar1) {
        pbVar2 = &DH;
      }
      else {
        bVar1 = std::operator==(flagName,"DL");
        if (bVar1) {
          pbVar2 = &DL;
        }
        else {
          bVar1 = std::operator==(flagName,"CH");
          if (bVar1) {
            pbVar2 = &CH;
          }
          else {
            bVar1 = std::operator==(flagName,"CL");
            if (bVar1) {
              pbVar2 = &CL;
            }
            else {
              bVar1 = std::operator==(flagName,"BH");
              if (bVar1) {
                pbVar2 = &BH;
              }
              else {
                std::operator==(flagName,"BL");
                pbVar2 = &BL;
              }
            }
          }
        }
      }
    }
  }
  return (uint8_t)(pbVar2->super__Base_bitset<1UL>)._M_w;
}

Assistant:

uint8_t GEN_Register::getReg_8(std::string flagName)
{
	if (flagName == "AH")
	{
		return (uint8_t)(AH.to_ulong());
	}
	else if (flagName == "AL")
	{
		return (uint8_t)(AL.to_ulong());
	}
    else if (flagName == "DH")
    {
        return (uint8_t)(DH.to_ulong());
    }
    else if (flagName == "DL")
    {
        return (uint8_t)(DL.to_ulong());
    }
    else if (flagName == "CH")
    {
        return (uint8_t)(CH.to_ulong());
    }
    else if (flagName == "CL")
    {
        return (uint8_t)(CL.to_ulong());
    }
    else if (flagName == "BH")
    {
        return (uint8_t)(BH.to_ulong());
    }
    else if (flagName == "BL")
    {
        return (uint8_t)(BL.to_ulong());
    }
}